

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::interleave<float>
               (float *src,int sstride,int uw,int vw,float *dst,int dstride,int nchan)

{
  float *pfVar1;
  float *end;
  float *sp;
  float *dp;
  float *rowend;
  float *drow;
  float *dstend;
  int dstride_local;
  float *dst_local;
  int vw_local;
  int uw_local;
  int sstride_local;
  float *src_local;
  
  src_local = src;
  for (dst_local = dst; dst_local != dst + nchan; dst_local = dst_local + 1) {
    drow = dst_local;
    pfVar1 = src_local + (sstride / 4) * vw;
    for (; src_local != pfVar1; src_local = src_local + sstride / 4) {
      dp = drow;
      sp = src_local;
      while (sp != src_local + uw) {
        *dp = *sp;
        dp = dp + nchan;
        sp = sp + 1;
      }
      drow = drow + dstride / 4;
    }
  }
  return;
}

Assistant:

inline void interleave(const T* src, int sstride, int uw, int vw,
                           T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        // for each channel
        for (T* dstend = dst + nchan; dst != dstend; dst++) {
            // for each row
            T* drow = dst;
            for (const T* rowend = src + sstride*vw; src != rowend;
                 src += sstride, drow += dstride) {
                // copy each pixel across the row
                T* dp = drow;
                for (const T* sp = src, * end = sp + uw; sp != end; dp += nchan)
                    *dp = *sp++;
            }
        }
    }